

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O3

Error * ot::commissioner::security_material::Init
                  (Error *__return_storage_ptr__,Config *aDefaultConfig)

{
  char cVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar3;
  char *pcVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string root;
  writer write;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  writer local_d0;
  string local_c8;
  string local_a8;
  format_string_checker<char> local_88;
  string local_50;
  
  pcVar2 = (aDefaultConfig->mThreadSMRoot)._M_dataplus._M_p;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + (aDefaultConfig->mThreadSMRoot)._M_string_length);
  if (local_e8 == 0) {
    pcVar4 = getenv("THREAD_SM_ROOT");
    pcVar5 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar5 = pcVar4;
    }
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar5);
    if (local_e8 == 0) {
      if (gVerbose == '\x01') {
        ppaVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)&local_88.context_.super_basic_format_parse_context<char>.format_str_.size_;
        local_88._0_8_ = ppaVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"ThreadSMRoot value is not available","");
        Console::Write((string *)&local_88,kYellow);
        _Var6._M_p = (pointer)local_88._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_88._0_8_ == ppaVar3) goto LAB_0020242d;
      }
      else {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"security-materials","")
        ;
        local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
        pcVar5 = "ThreadSMRoot value is not available";
        local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "ThreadSMRoot value is not available";
        local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
        local_88.context_.super_basic_format_parse_context<char>._16_8_ = 0;
        local_88.parse_funcs_[0] = (parse_func)0x0;
        local_d0.handler_ = &local_88;
        local_88.context_.types_ = local_88.types_;
        do {
          cVar1 = *pcVar5;
          pcVar4 = pcVar5;
          while (cVar1 != '{') {
            pcVar4 = pcVar4 + 1;
            if (pcVar4 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&local_d0,pcVar5,"");
              goto LAB_0020255c;
            }
            cVar1 = *pcVar4;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_d0,pcVar5,pcVar4);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar4,"",&local_88);
        } while (pcVar5 != "");
LAB_0020255c:
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_88;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_50,(v10 *)"ThreadSMRoot value is not available",(string_view)ZEXT816(0x23)
                   ,args);
        Log(kDebug,&local_c8,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        _Var6._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0020242d;
      }
      operator_delete(_Var6._M_p);
    }
  }
LAB_0020242d:
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_f0,local_f0 + local_e8);
  SMRoot::Set((SMRoot *)&smRoot,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Init(const Config &aDefaultConfig)
{
    std::string root = aDefaultConfig.mThreadSMRoot;

    if (root.empty())
    {
        root = SafeStr(getenv("THREAD_SM_ROOT"));
        if (root.empty())
        {
            if (gVerbose)
            {
                Console::Write(SM_ERROR_MESSAGE_NO_ROOT_AVAILABLE, Console::Color::kYellow);
            }
            else
            {
                LOG_DEBUG(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_NO_ROOT_AVAILABLE);
            }
        }
    }
    smRoot.Set(root);
    return ERROR_NONE;
}